

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::HugeIntegerCastOperation::
     Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
               (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *state)

{
  ResultType *this;
  hugeint_t left;
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  hugeint_t hStack_48;
  hugeint_t local_38;
  
  bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::Flush(state);
  if ((bVar1) &&
     (bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::FlushDecimal(state), bVar1)
     ) {
    this = &state->decimal;
    hugeint_t::hugeint_t(&hStack_48,0);
    bVar1 = hugeint_t::operator==(this,&hStack_48);
    if (bVar1) {
      bVar1 = true;
    }
    else {
      bVar1 = true;
      if (state->decimal_total_digits != 0) {
        uVar3 = state->decimal_total_digits;
        uVar4 = (uint)uVar3;
        while (0x27 < uVar3) {
          hugeint_t::operator/=(this,(hugeint_t *)(Hugeint::POWERS_OF_TEN + 0x270));
          uVar4 = *(int *)&state->decimal_total_digits - 0x27;
          uVar3 = (ushort)uVar4;
          state->decimal_total_digits = uVar3;
        }
        hugeint_t::operator/=
                  (this,(hugeint_t *)
                        (&TupleDataAllocator::
                          ReleaseOrStoreHandles(duckdb::TupleDataPinState&,duckdb::TupleDataSegment&)
                          ::DUMMY_CHUNK + ((uVar4 & 0xffff) << 4)));
        hugeint_t::hugeint_t(&hStack_48,5);
        bVar2 = hugeint_t::operator>=(this,&hStack_48);
        if (bVar2) {
          left.lower = (state->result).lower;
          left.upper = (state->result).upper;
          hugeint_t::hugeint_t(&local_38,1);
          bVar1 = TryAddOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                            (left,local_38,&state->result);
        }
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		if (!state.Flush() || !state.FlushDecimal()) {
			return false;
		}

		if (state.decimal == 0 || state.decimal_total_digits == 0) {
			return true;
		}

		// Get the first (left-most) digit of the decimals
		while (state.decimal_total_digits > 39) {
			state.decimal /= T::Operation::POWERS_OF_TEN[39];
			state.decimal_total_digits -= 39;
		}
		D_ASSERT((state.decimal_total_digits - 1) >= 0 && (state.decimal_total_digits - 1) <= 39);
		state.decimal /= T::Operation::POWERS_OF_TEN[state.decimal_total_digits - 1];

		if (state.decimal >= 5) {
			if (NEGATIVE) {
				return TrySubtractOperator::Operation(state.result, result_t(1), state.result);
			} else {
				return TryAddOperator::Operation(state.result, result_t(1), state.result);
			}
		}
		return true;
	}